

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O3

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint
          (DebugDocument *this,StatementLocation statement,BREAKPOINT_STATE bps)

{
  ScriptContext *this_00;
  DebugManager *pDVar1;
  code *pcVar2;
  FunctionBody *_pBody;
  Type _characterOffset;
  bool bVar3;
  int iVar4;
  ArenaAllocator *alloc;
  BreakpointProbe *this_01;
  undefined4 *puVar5;
  BreakpointProbeList *list;
  undefined8 *puVar6;
  UINT breakpointId;
  long lVar7;
  undefined1 local_c8 [8];
  ArenaAllocator arena;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  if (this_00 != (ScriptContext *)0x0) {
    iVar4 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00);
    if ((char)iVar4 == '\0') {
      if (BREAKPOINT_DISABLED < bps) {
        if (bps == BREAKPOINT_ENABLED) {
          alloc = ScriptContext::AllocatorForDiagnostics(this_00);
          this_01 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
          pDVar1 = this_00->threadContext->debugManager;
          breakpointId = pDVar1->nextBreakPointId + 1;
          pDVar1->nextBreakPointId = breakpointId;
          BreakpointProbe::BreakpointProbe(this_01,this,&statement,breakpointId);
          ScriptContext::GetDebugContext(this_00);
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                    ,0x65,"(0)","Bad breakpoint state");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      list = GetBreakpointList(this);
      if (list != (BreakpointProbeList *)0x0) {
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
        ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c8,L"TemporaryBreakpointList",
                           &this_00->threadContext->debugManager->diagnosticPageAllocator,
                           Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
        puVar6 = (undefined8 *)new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)local_c8,0x364470)
        ;
        _characterOffset = statement.statement.begin;
        _pBody = statement.function;
        puVar6[3] = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_c8;
        *puVar6 = &PTR_IsReadOnly_014e1ec0;
        puVar6[1] = 0;
        *(undefined4 *)(puVar6 + 2) = 0;
        puVar6[4] = 0x400000000;
        if (0 < (list->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count) {
          lVar7 = 0;
          do {
            bVar3 = BreakpointProbe::Matches
                              ((list->
                               super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                               ).buffer[lVar7],_pBody,_characterOffset);
            if (bVar3) {
              ScriptContext::GetDebugContext(this_00);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (list->
                           super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                           ).count);
          if (0 < *(int *)(puVar6 + 2)) {
            lVar7 = 0;
            do {
              arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList = *(void **)(puVar6[1] + lVar7 * 8);
              CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              ::Remove((CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                        *)&list->field_0x28,list,
                       (TElementType *)
                       &arena.
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        freeList);
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)(puVar6 + 2));
          }
        }
        *(undefined4 *)(puVar6 + 2) = 0;
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
        ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            local_c8);
      }
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint(StatementLocation statement, BREAKPOINT_STATE bps)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        switch (bps)
        {
            default:
                AssertMsg(FALSE, "Bad breakpoint state");
                // Fall thru
            case BREAKPOINT_DISABLED:
            case BREAKPOINT_DELETED:
            {
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                if (pBreakpointList)
                {
                    ArenaAllocator arena(_u("TemporaryBreakpointList"), scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
                    BreakpointProbeList* pDeleteList = this->NewBreakpointList(&arena);

                    pBreakpointList->Map([&statement, scriptContext, pDeleteList](int index, BreakpointProbe * breakpointProbe)
                    {
                        if (breakpointProbe->Matches(statement.function, statement.statement.begin))
                        {
                            scriptContext->GetDebugContext()->GetProbeContainer()->RemoveProbe(breakpointProbe);
                            pDeleteList->Add(breakpointProbe);
                        }
                    });

                    pDeleteList->Map([pBreakpointList](int index, BreakpointProbe * breakpointProbe)
                    {
                        pBreakpointList->Remove(breakpointProbe);
                    });
                    pDeleteList->Clear();
                }

                break;
            }
            case BREAKPOINT_ENABLED:
            {
                BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement,
                    scriptContext->GetThreadContext()->GetDebugManager()->GetNextBreakpointId());

                scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                pBreakpointList->Add(pProbe);
                return pProbe;
                break;
            }
        }
        return nullptr;
    }